

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct
          (CompilerGLSL *this,string *basename,uint32_t rhs_id,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  size_type *psVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  uint *puVar5;
  SPIRType *type_00;
  SPIRType *pSVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  SmallVector<unsigned_int,_8UL> *indices_00;
  long lVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rhs;
  SmallVector<unsigned_int,_8UL> sub_indices;
  string lhs;
  string local_f0;
  string local_d0;
  string local_b0;
  string *local_90;
  SmallVector<unsigned_int,_8UL> local_88;
  string local_50;
  
  local_88.super_VectorView<unsigned_int>.ptr = (uint *)&local_88.stack_storage;
  local_88.super_VectorView<unsigned_int>.buffer_size = 0;
  local_88.buffer_capacity = 8;
  indices_00 = indices;
  local_90 = basename;
  SmallVector<unsigned_int,_8UL>::operator=(&local_88,indices);
  SmallVector<unsigned_int,_8UL>::reserve
            (&local_88,local_88.super_VectorView<unsigned_int>.buffer_size + 1);
  pcVar2 = (char *)local_88.super_VectorView<unsigned_int>.ptr +
           local_88.super_VectorView<unsigned_int>.buffer_size * 4;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  local_88.super_VectorView<unsigned_int>.buffer_size =
       local_88.super_VectorView<unsigned_int>.buffer_size + 1;
  sVar4 = (indices->super_VectorView<unsigned_int>).buffer_size;
  type_00 = type;
  if (sVar4 != 0) {
    puVar5 = (indices->super_VectorView<unsigned_int>).ptr;
    lVar9 = 0;
    do {
      type_00 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (type_00->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [*(uint *)((long)puVar5 + lVar9)].id);
      lVar9 = lVar9 + 4;
    } while (sVar4 << 2 != lVar9);
  }
  if ((int)(type_00->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           buffer_size != 0) {
    paVar3 = &local_f0.field_2;
    uVar10 = 0;
    do {
      *(uint32_t *)
       ((char *)local_88.super_VectorView<unsigned_int>.ptr +
       local_88.super_VectorView<unsigned_int>.buffer_size * 4 + -4) = (uint32_t)uVar10;
      to_member_name_abi_cxx11_(&local_f0,this,type_00,(uint32_t)uVar10);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                (&local_50,(spirv_cross *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3e75a6,
                 (char (*) [2])&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      ParsedIR::sanitize_underscores(&local_50);
      pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (type_00->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar10]
                          .id);
      if (pSVar6->basetype == Struct) {
        indices_00 = &local_88;
        store_flattened_struct(this,&local_50,rhs_id,type,indices_00);
      }
      else {
        to_expression_abi_cxx11_(&local_b0,this,rhs_id,true);
        to_multi_member_reference_abi_cxx11_(&local_d0,this,type,&local_88);
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar8 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_d0._M_string_length + local_b0._M_string_length) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            uVar8 = local_d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_d0._M_string_length + local_b0._M_string_length)
          goto LAB_0033d6ec;
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::replace
                             ((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
LAB_0033d6ec:
          puVar7 = (undefined8 *)
                   ::std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
        }
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_f0.field_2._M_allocated_capacity = *psVar1;
          local_f0.field_2._8_8_ = puVar7[3];
          local_f0._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar1;
          local_f0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_f0._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        indices_00 = (SmallVector<unsigned_int,_8UL> *)0x405f81;
        statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_50,(char (*) [4])0x3fb085,&local_f0,(char (*) [2])0x405f81);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar3) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (uint)(type_00->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                            buffer_size);
  }
  local_88.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_88.super_VectorView<unsigned_int>.ptr !=
      &local_88.stack_storage) {
    free(local_88.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(const string &basename, uint32_t rhs_id, const SPIRType &type,
                                          const SmallVector<uint32_t> &indices)
{
	SmallVector<uint32_t> sub_indices = indices;
	sub_indices.push_back(0);

	auto *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		auto lhs = join(basename, "_", to_member_name(*member_type, i));
		ParsedIR::sanitize_underscores(lhs);

		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
		{
			store_flattened_struct(lhs, rhs_id, type, sub_indices);
		}
		else
		{
			auto rhs = to_expression(rhs_id) + to_multi_member_reference(type, sub_indices);
			statement(lhs, " = ", rhs, ";");
		}
	}
}